

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode ossl_connect_common(Curl_cfilter *cf,Curl_easy *data,_Bool nonblocking,_Bool *done)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  curl_trc_feat *pcVar4;
  ossl_ctx *octx;
  ssl_peer *psVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  CURLcode CVar9;
  uint err;
  timediff_t tVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  SSL_CIPHER *c;
  char *pcVar14;
  char *pcVar15;
  size_t alpn_len;
  BIO_METHOD *type;
  BIO *pBVar16;
  uint *puVar17;
  ulong error;
  int *piVar18;
  int psigtype_nid;
  uchar *neg_protocol;
  uint local_19c;
  ulong *local_198;
  ssl_config_data *local_190;
  ulong local_188 [10];
  alpn_proto_buf local_138 [6];
  
  pvVar1 = cf->ctx;
  uVar6 = Curl_conn_cf_get_socket(cf,data);
  *(undefined4 *)((long)pvVar1 + 0x58) = 0;
  if (*(int *)((long)pvVar1 + 0x50) == 2) {
    *done = true;
  }
  else {
    if (*(int *)((long)pvVar1 + 0x54) == 0) {
      tVar10 = Curl_timeleft(data,(curltime *)0x0,true);
      if (tVar10 < 0) {
LAB_0016aed5:
        Curl_failf(data,"SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      psVar5 = (ssl_peer *)cf->ctx;
      octx = (ossl_ctx *)psVar5[1].dispname;
      local_138[0].data[0x10] = '\0';
      local_138[0].data[0x11] = '\0';
      local_138[0].data[0x12] = '\0';
      local_138[0].data[0x13] = '\0';
      local_138[0].data[0x14] = '\0';
      local_138[0].data[0x15] = '\0';
      local_138[0].data[0x16] = '\0';
      local_138[0].data[0x17] = '\0';
      local_138[0].data[0x18] = '\0';
      local_138[0].data[0x19] = '\0';
      local_138[0].data[0x1a] = '\0';
      local_138[0].data[0x1b] = '\0';
      local_138[0].data[0x1c] = '\0';
      local_138[0].data[0x1d] = '\0';
      local_138[0].data[0x1e] = '\0';
      local_138[0].data[0x1f] = '\0';
      local_138[0].data._0_8_ = (uchar *)0x0;
      local_138[0].data[8] = '\0';
      local_138[0].data[9] = '\0';
      local_138[0].data[10] = '\0';
      local_138[0].data[0xb] = '\0';
      local_138[0].data[0xc] = '\0';
      local_138[0].data[0xd] = '\0';
      local_138[0].data[0xe] = '\0';
      local_138[0].data[0xf] = '\0';
      local_138[0].data[0x20] = '\0';
      local_138[0]._33_3_ = 0;
      local_138[0].len = 0;
      if ((alpn_spec *)psVar5[1].hostname == (alpn_spec *)0x0) {
        alpn_len = 0;
      }
      else {
        CVar9 = Curl_alpn_to_proto_buf(local_138,(alpn_spec *)psVar5[1].hostname);
        if (CVar9 != CURLE_OK) {
          Curl_failf(data,"Error determining ALPN");
          return CURLE_SSL_CONNECT_ERROR;
        }
        alpn_len = (size_t)local_138[0].len;
      }
      CVar9 = Curl_ossl_ctx_init(octx,cf,data,psVar5,3,local_138[0].data,alpn_len,
                                 (Curl_ossl_ctx_setup_cb *)0x0,(void *)0x0,ossl_new_session_cb,cf);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      type = (BIO_METHOD *)BIO_meth_new(0x401,"OpenSSL CF BIO");
      if (type == (BIO_METHOD *)0x0) {
        octx->bio_method = (BIO_METHOD *)0x0;
        return CURLE_OUT_OF_MEMORY;
      }
      BIO_meth_set_write(type,ossl_bio_cf_out_write);
      BIO_meth_set_read(type,ossl_bio_cf_in_read);
      BIO_meth_set_ctrl(type,ossl_bio_cf_ctrl);
      BIO_meth_set_create(type,ossl_bio_cf_create);
      BIO_meth_set_destroy(type,ossl_bio_cf_destroy);
      octx->bio_method = (BIO_METHOD *)type;
      pBVar16 = BIO_new(type);
      if (pBVar16 == (BIO *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      BIO_set_data(pBVar16,cf);
      BIO_up_ref(pBVar16);
      SSL_set0_rbio(octx->ssl,pBVar16);
      SSL_set0_wbio(octx->ssl,pBVar16);
      if (((((alpn_spec *)psVar5[1].hostname != (alpn_spec *)0x0) &&
           (Curl_alpn_to_proto_str(local_138,(alpn_spec *)psVar5[1].hostname),
           data != (Curl_easy *)0x0)) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"ALPN: curl offers %s",local_138);
      }
      *(undefined4 *)((long)&psVar5[2].hostname + 4) = 1;
    }
    local_198 = local_188;
    do {
      iVar7 = *(int *)((long)pvVar1 + 0x54);
      if (iVar7 != 1) {
        if (iVar7 == 2) {
          psVar5 = (ssl_peer *)cf->ctx;
          CVar9 = Curl_oss_check_peer_cert(cf,data,(ossl_ctx *)psVar5[1].dispname,psVar5);
          if (CVar9 != CURLE_OK) {
            return CVar9;
          }
          *(undefined4 *)((long)&psVar5[2].hostname + 4) = 3;
          iVar7 = *(int *)((long)pvVar1 + 0x54);
        }
        if (iVar7 == 3) {
          *(undefined4 *)((long)pvVar1 + 0x50) = 2;
        }
        *done = iVar7 == 3;
        *(undefined4 *)((long)pvVar1 + 0x54) = 0;
        return CURLE_OK;
      }
      tVar10 = Curl_timeleft(data,(curltime *)0x0,true);
      if (tVar10 < 0) goto LAB_0016aed5;
      if ((!nonblocking) && (uVar8 = *(uint *)((long)pvVar1 + 0x58), uVar8 != 0)) {
        iVar7 = Curl_socket_check(-(uint)((uVar8 & 1) == 0) | uVar6,-1,
                                  -(uint)((uVar8 & 2) == 0) | uVar6,tVar10);
        if (iVar7 < 0) {
          puVar17 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar17);
          return CURLE_SSL_CONNECT_ERROR;
        }
        if (iVar7 == 0) goto LAB_0016aed5;
      }
      puVar2 = (undefined8 *)cf->ctx;
      puVar3 = (undefined8 *)puVar2[6];
      local_190 = Curl_ssl_cf_get_config(cf,data);
      *(undefined4 *)(puVar2 + 0xb) = 0;
      ERR_clear_error();
      uVar8 = SSL_connect((SSL *)puVar3[1]);
      if ((*(byte *)((long)puVar3 + 0x25) & 1) == 0) {
        CVar9 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar3);
        if (CVar9 != CURLE_OK) {
          return CVar9;
        }
        *(byte *)((long)puVar3 + 0x25) = *(byte *)((long)puVar3 + 0x25) | 1;
      }
      if (uVar8 == 1) {
        local_188[0] = local_188[0] & 0xffffffff00000000;
        *(undefined4 *)((long)puVar2 + 0x54) = 2;
        SSL_get_peer_signature_type_nid(puVar3[1],local_188);
        lVar11 = SSL_ctrl((SSL *)puVar3[1],0x86,0,(void *)0x0);
        pcVar12 = OBJ_nid2sn((uint)lVar11 & 0xffff);
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          pcVar13 = SSL_get_version((SSL *)puVar3[1]);
          c = SSL_get_current_cipher((SSL *)puVar3[1]);
          pcVar14 = SSL_CIPHER_get_name(c);
          if (pcVar12 == (char *)0x0) {
            pcVar12 = "[blank]";
          }
          pcVar15 = OBJ_nid2sn((int)local_188[0]);
          Curl_infof(data,"SSL connection using %s / %s / %s / %s",pcVar13,pcVar14,pcVar12,pcVar15);
        }
        if (puVar2[5] != 0) {
          SSL_get0_alpn_selected(puVar3[1],local_138,&local_19c);
          CVar9 = Curl_alpn_set_negotiated
                            (cf,data,(uchar *)local_138[0].data._0_8_,(ulong)local_19c);
          if (CVar9 != CURLE_OK) {
            return CVar9;
          }
        }
      }
      else {
        err = SSL_get_error((SSL *)puVar3[1],uVar8);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
            ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)
             ))) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"SSL_connect() -> err=%d, detail=%d",(ulong)uVar8,(ulong)err);
        }
        if ((int)err < 9) {
          if (err == 2) {
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar4->log_level)) && (0 < cf->cft->log_level)))) {
              Curl_trc_cf_infof(data,cf,"SSL_connect() -> want recv");
            }
            *(undefined4 *)(puVar2 + 0xb) = 1;
          }
          else {
            if (err != 3) {
LAB_0016b0f8:
              memset(local_138,0,0x100);
              *(undefined4 *)((long)puVar2 + 0x54) = 1;
              error = ERR_get_error();
              uVar6 = (uint)error;
              if ((uVar6 & 0xff800000) == 0xa000000 && -1 < (int)uVar6) {
                uVar6 = uVar6 & 0x7fffff;
                if (uVar6 != 0x86) {
                  if (uVar6 == 0x45c) {
                    ossl_strerror(error,(char *)local_138,0x100);
                    CVar9 = CURLE_SSL_CLIENTCERT;
                    goto LAB_0016b298;
                  }
                  if (uVar6 != 0x415) goto LAB_0016b1a3;
                }
                lVar11 = SSL_get_verify_result((SSL *)puVar3[1]);
                if (lVar11 == 0) {
                  builtin_memcpy(local_138[0].data,"verification fai",0x10);
                  builtin_memcpy(local_138[0].data,"SSL certificate ",0x10);
                  local_138[0]._32_4_ = 0x64656c;
                }
                else {
                  local_190->certverifyresult = lVar11;
                  pcVar12 = X509_verify_cert_error_string(lVar11);
                  curl_msnprintf((char *)local_138,0x100,"SSL certificate problem: %s",pcVar12);
                }
                CVar9 = CURLE_PEER_FAILED_VERIFICATION;
LAB_0016b298:
                Curl_failf(data,"%s",local_138);
                return CVar9;
              }
LAB_0016b1a3:
              ossl_strerror(error,(char *)local_138,0x100);
              CVar9 = CURLE_SSL_CONNECT_ERROR;
              if (error != 0) goto LAB_0016b298;
              local_188[8] = 0;
              local_188[9] = 0;
              local_188[6] = 0;
              local_188[7] = 0;
              local_188[4] = 0;
              local_188[5] = 0;
              local_188[2] = 0;
              local_188[3] = 0;
              local_188[0] = 0;
              local_188[1] = 0;
              piVar18 = __errno_location();
              if ((*piVar18 != 0) && (err == 5)) {
                Curl_strerror(*piVar18,(char *)local_188,0x50);
                if ((char)local_188[0] != '\0') goto LAB_0016b223;
              }
              local_198 = (ulong *)SSL_ERROR_to_str(err);
LAB_0016b223:
              Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%d ",local_198,*puVar2,
                         (ulong)*(uint *)((long)puVar2 + 0x1c));
              return CURLE_SSL_CONNECT_ERROR;
            }
            if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar4->log_level)))) && (0 < cf->cft->log_level)) {
              Curl_trc_cf_infof(data,cf,"SSL_connect() -> want send");
            }
            *(undefined4 *)(puVar2 + 0xb) = 2;
          }
        }
        else {
          if (err == 9) {
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar4->log_level)) && (0 < cf->cft->log_level)))) {
              pcVar12 = "SSL_connect() -> want async";
LAB_0016ae29:
              Curl_trc_cf_infof(data,cf,pcVar12);
            }
          }
          else {
            if (err != 0xc) goto LAB_0016b0f8;
            if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar4->log_level)))) && (0 < cf->cft->log_level)) {
              pcVar12 = "SSL_connect() -> want retry_verify";
              goto LAB_0016ae29;
            }
          }
          *(undefined8 *)((long)puVar2 + 0x54) = 0x100000001;
        }
      }
    } while ((!nonblocking) || (*(int *)((long)pvVar1 + 0x54) != 1));
  }
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;
  curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
  int what;

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we are allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  while(ssl_connect_2 == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }

    /* if ssl is expecting something, check if it is available. */
    if(!nonblocking && connssl->io_need) {

      curl_socket_t writefd = (connssl->io_need & CURL_SSL_IO_NEED_SEND)?
                              sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = (connssl->io_need & CURL_SSL_IO_NEED_RECV)?
                             sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        result = CURLE_SSL_CONNECT_ERROR;
        goto out;
      }
      if(0 == what) {
        /* timeout */
        failf(data, "SSL connection timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(cf, data);
    if(result || (nonblocking && (ssl_connect_2 == connssl->connecting_state)))
      goto out;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

out:
  return result;
}